

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O1

string * to_lower(string *__return_storage_ptr__,string *line)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  ostringstream oss;
  char local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar1 = line->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (line->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar4]);
      local_1a9 = (char)iVar3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_lower(const std::string& line)
{
	std::ostringstream oss;
	for (auto& ch : line)
	{
		oss << static_cast<char>(std::tolower(ch));
	}
	return oss.str();
}